

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

bool __thiscall
DerBase::Decode<std::__cxx11::wstring>
          (DerBase *this,uchar *pIn,size_t cbIn,DerType type,size_t *cbUsed,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  bool bVar1;
  size_t sStack_50;
  size_t local_40;
  size_t size;
  size_t cbPrefix;
  
  local_40 = 0;
  size = 0;
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = L'\0';
  bVar1 = CheckDecode(pIn,cbIn,type,&local_40,&size);
  if (bVar1) {
    *cbUsed = local_40 + size;
    std::__cxx11::wstring::insert<unsigned_char_const*,void>
              ((wstring *)value,(const_iterator)(value->_M_dataplus)._M_p,pIn + size,
               pIn + local_40 + size);
    this->cbData = value->_M_string_length;
    bVar1 = true;
  }
  else {
    if (((cbIn < 2) || (*pIn != '\x05')) || (pIn[1] != '\0')) {
      sStack_50 = 0;
      bVar1 = false;
    }
    else {
      bVar1 = true;
      sStack_50 = 2;
    }
    *cbUsed = sStack_50;
  }
  return bVar1;
}

Assistant:

bool Decode(const unsigned char* pIn, size_t cbIn, const DerType type, size_t& cbUsed, T& value)
	{
		size_t size = 0;
		size_t cbPrefix = 0;

		value.clear();

		if (!CheckDecode(pIn, cbIn, type, size, cbPrefix))
		{
			// Allow Null, will correctly set cbUsed
			return DecodeNull(pIn, cbIn, cbUsed);
		}

		cbUsed = cbPrefix + static_cast<size_t>(size);
		value.insert(value.begin(), pIn + cbPrefix, pIn + cbUsed);
		cbData = value.size();
		return true;
	}